

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPBase.cpp
# Opt level: O0

ResizeResult __thiscall
adios2::format::BPBase::ResizeBuffer(BPBase *this,size_t dataIn,string *hint)

{
  BufferSTL *this_00;
  ulong in_RSI;
  long in_RDI;
  size_t nextSize;
  float growthFactor;
  ResizeResult result;
  size_t maxBufferSize;
  size_t requiredSize;
  size_t currentSize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc58;
  allocator *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc88;
  float in_stack_fffffffffffffc90;
  float in_stack_fffffffffffffc94;
  float in_stack_fffffffffffffc98;
  float in_stack_fffffffffffffc9c;
  string *activity;
  string *source;
  string *component;
  allocator local_321;
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [8];
  string *in_stack_fffffffffffffd68;
  IOChrono *in_stack_fffffffffffffd70;
  size_t in_stack_fffffffffffffd78;
  BufferSTL *in_stack_fffffffffffffd80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [39];
  undefined1 local_e1 [40];
  undefined1 local_b9 [40];
  undefined1 local_91 [37];
  ResizeResult local_6c;
  ulong local_68;
  ulong local_60;
  size_type local_58;
  allocator local_39;
  string local_38 [40];
  ulong local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"buffering",&local_39);
  profiling::IOChrono::Start(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_58 = std::vector<char,_std::allocator<char>_>::size
                       ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x70));
  local_60 = local_10 + *(long *)(in_RDI + 0x60);
  local_68 = *(ulong *)(in_RDI + 0x210);
  local_6c = Unchanged;
  if (local_68 < local_10) {
    component = (string *)local_91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_91 + 1),"Toolkit",(allocator *)component);
    source = (string *)local_b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_b9 + 1),"format::bp::BPBase",(allocator *)source);
    activity = (string *)local_e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_e1 + 1),"ResizeBuffer",(allocator *)activity);
    in_stack_fffffffffffffc98 = (float)(long)local_10;
    in_stack_fffffffffffffc9c = (float)local_10;
    std::__cxx11::to_string((double)in_stack_fffffffffffffc58);
    std::operator+((char *)in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
    std::operator+(in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50);
    in_stack_fffffffffffffc90 = (float)(long)local_68;
    in_stack_fffffffffffffc94 = (float)local_68;
    std::__cxx11::to_string((double)in_stack_fffffffffffffc58);
    std::operator+(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
    std::operator+(in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50);
    std::operator+(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
    helper::Throw<std::runtime_error>
              (component,source,activity,
               (string *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
               (int)in_stack_fffffffffffffc94);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string(local_148);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::string::~string(local_168);
    std::__cxx11::string::~string(local_188);
    std::__cxx11::string::~string(local_1a8);
    std::__cxx11::string::~string((string *)(local_e1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_e1);
    std::__cxx11::string::~string((string *)(local_b9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_b9);
    std::__cxx11::string::~string((string *)(local_91 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_91);
  }
  if (local_58 < local_60) {
    if (local_68 < local_60) {
      if (local_58 < local_68) {
        in_stack_fffffffffffffc88 = &local_268;
        std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffc88);
        std::operator+((char *)in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
        std::operator+(in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50);
        std::operator+(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
        std::operator+(in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50);
        BufferSTL::Resize(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                          (string *)in_stack_fffffffffffffd70);
        std::__cxx11::string::~string(local_1e8);
        std::__cxx11::string::~string(local_208);
        std::__cxx11::string::~string(local_228);
        std::__cxx11::string::~string(local_248);
        std::__cxx11::string::~string((string *)&local_268);
      }
      local_6c = Flush;
    }
    else if (local_58 < local_68) {
      this_00 = (BufferSTL *)
                helper::NextExponentialSize
                          (CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                           CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                           (float)((ulong)in_stack_fffffffffffffc88 >> 0x20));
      std::min<unsigned_long>(&local_68,(unsigned_long *)&stack0xfffffffffffffd80);
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffc88);
      std::operator+((char *)in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
      std::operator+(in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50);
      std::operator+(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
      BufferSTL::Resize(this_00,in_stack_fffffffffffffd78,(string *)in_stack_fffffffffffffd70);
      std::__cxx11::string::~string(local_2a0);
      std::__cxx11::string::~string(local_2c0);
      std::__cxx11::string::~string(local_2e0);
      std::__cxx11::string::~string(local_300);
      local_6c = Success;
    }
  }
  paVar1 = &local_321;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_320,"buffering",paVar1);
  profiling::IOChrono::Stop
            ((IOChrono *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
             in_stack_fffffffffffffc88);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  return local_6c;
}

Assistant:

BPBase::ResizeResult BPBase::ResizeBuffer(const size_t dataIn, const std::string hint)
{
    m_Profiler.Start("buffering");
    const size_t currentSize = m_Data.m_Buffer.size();
    const size_t requiredSize = dataIn + m_Data.m_Position;
    const size_t maxBufferSize = m_Parameters.MaxBufferSize;

    ResizeResult result = ResizeResult::Unchanged;

    if (dataIn > maxBufferSize)
    {
        helper::Throw<std::runtime_error>(
            "Toolkit", "format::bp::BPBase", "ResizeBuffer",
            "data size: " + std::to_string(static_cast<float>(dataIn) / (1024. * 1024.)) +
                " Mb is too large for adios2 bp MaxBufferSize=" +
                std::to_string(static_cast<float>(maxBufferSize) / (1024. * 1024.)) +
                "Mb, try increasing MaxBufferSize in call to IO "
                "SetParameters " +
                hint);
    }

    if (requiredSize <= currentSize)
    {
        // do nothing, unchanged is default
    }
    else if (requiredSize > maxBufferSize)
    {
        if (currentSize < maxBufferSize)
        {
            m_Data.Resize(maxBufferSize, " when resizing buffer to " +
                                             std::to_string(maxBufferSize) + "bytes, " + hint +
                                             "\n");
        }
        result = ResizeResult::Flush;
    }
    else // buffer must grow
    {
        if (currentSize < maxBufferSize)
        {
            const float growthFactor = m_Parameters.GrowthFactor;
            const size_t nextSize =
                std::min(maxBufferSize,
                         helper::NextExponentialSize(requiredSize, currentSize, growthFactor));
            m_Data.Resize(nextSize, " when resizing buffer to " + std::to_string(nextSize) +
                                        "bytes, " + hint);
            result = ResizeResult::Success;
        }
    }

    m_Profiler.Stop("buffering");
    return result;
}